

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmVariableAccess(ExpressionContext *ctx,VmModule *module,ExprVariableAccess *node)

{
  VariableData *source;
  TypeBase *type;
  SynIdentifier *pSVar1;
  char *pcVar2;
  VmValue *pVVar3;
  VariableData *variable;
  TypeBase *in_RCX;
  uint in_R9D;
  
  source = node->variable;
  type = (TypeBase *)((InplaceStr *)&source->type)->begin;
  if ((type == (TypeBase *)0x0) || (type->typeID != 1)) {
    variable = (VariableData *)ExpressionContext::GetReferenceType(ctx,type);
    pVVar3 = anon_unknown.dwarf_f89de::CreateVariableAddress
                       (module,(SynBase *)source,variable,in_RCX);
    pVVar3 = anon_unknown.dwarf_f89de::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->variable->type,pVVar3,in_R9D)
    ;
    pSVar1 = node->variable->name;
    pcVar2 = (pSVar1->name).end;
    (pVVar3->comment).begin = (pSVar1->name).begin;
    (pVVar3->comment).end = pcVar2;
  }
  else {
    pVVar3 = anon_unknown.dwarf_f89de::CreateVoid(module);
  }
  pVVar3 = anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmVariableAccess(ExpressionContext &ctx, VmModule *module, ExprVariableAccess *node)
{
	if(isType<TypeVoid>(node->variable->type))
		return CheckType(ctx, node, CreateVoid(module));

	VmValue *address = CreateVariableAddress(module, node->source, node->variable, ctx.GetReferenceType(node->variable->type));

	VmValue *value = CreateLoad(ctx, module, node->source, node->variable->type, address, 0);

	value->comment = node->variable->name->name;

	return CheckType(ctx, node, value);
}